

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_dumb.cpp
# Opt level: O0

long __thiscall
input_mod::render(input_mod *this,double volume,double delta,long samples,sample_t_conflict **buffer
                 )

{
  bool bVar1;
  int32 iVar2;
  long lVar3;
  sample_t_conflict **in_stack_ffffffffffffffc8;
  long written;
  sample_t_conflict **buffer_local;
  long samples_local;
  double delta_local;
  double volume_local;
  input_mod *this_local;
  
  written._4_4_ = (int32)((ulong)buffer >> 0x20);
  iVar2 = duh_sigrenderer_generate_samples
                    ((DUH_SIGRENDERER *)volume,delta,(double)samples,written._4_4_,
                     in_stack_ffffffffffffffc8);
  lVar3 = (long)iVar2;
  if (lVar3 < samples) {
    if (((this->super_StreamSong).super_MusInfo.m_Looping & 1U) == 0) {
      this->eof = true;
    }
    else {
      duh_end_sigrenderer((DUH_SIGRENDERER *)0x42aaf4);
      this->sr = (DUH_SIGRENDERER *)0x0;
      bVar1 = open2(this,0);
      if (!bVar1) {
        this->eof = true;
      }
    }
  }
  return lVar3;
}

Assistant:

long input_mod::render(double volume, double delta, long samples, sample_t **buffer)
{
	long written = duh_sigrenderer_generate_samples(sr, volume, delta, samples, buffer);

	if (written < samples)
	{
		if (!m_Looping)
		{
			eof = true;
		}
		else
		{
			duh_end_sigrenderer(sr);
			sr = NULL;
			if (!open2(0))
			{
				eof = true;
			}
		}
	}
	return written;
}